

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_EnumValueFeaturesOverride_Test::TestBody
          (FeaturesTest_EnumValueFeaturesOverride_Test *this)

{
  EnumDescriptor *pEVar1;
  EnumValueDescriptor *pEVar2;
  FileDescriptor *pFVar3;
  MessageLite *pMVar4;
  Nonnull<const_char_*> pcVar5;
  undefined8 extraout_RAX;
  char *pcVar6;
  pointer *__ptr;
  long v2;
  Metadata MVar7;
  string_view file_text;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  AssertHelper local_30;
  internal local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  MVar7 = DescriptorProto::GetMetadata((DescriptorProto *)_DescriptorProto_default_instance_);
  ValidationErrorTest::BuildFileInTestPool((ValidationErrorTest *)this,(MVar7.descriptor)->file_);
  MVar7 = pb::TestFeatures::GetMetadata((TestFeatures *)pb::_TestFeatures_default_instance_);
  ValidationErrorTest::BuildFileInTestPool((ValidationErrorTest *)this,(MVar7.descriptor)->file_);
  file_text._M_str =
       "\n    name: \"foo.proto\"\n    syntax: \"editions\"\n    edition: EDITION_2023\n    dependency: \"google/protobuf/unittest_features.proto\"\n    options {\n      features {\n        [pb.test] { multiple_feature: VALUE7 }\n      }\n    }\n    enum_type {\n      name: \"Foo\"\n      options {\n        features {\n          [pb.test] { multiple_feature: VALUE8 }\n        }\n      }\n      value {\n        name: \"BAR\"\n        number: 0\n        options {\n          features {\n            [pb.test] { multiple_feature: VALUE9 enum_entry_feature: VALUE8 }\n          }\n        }\n      }\n    }\n  "
  ;
  file_text._M_len = 0x235;
  pFVar3 = ValidationErrorTest::BuildFile((ValidationErrorTest *)this,file_text);
  if ((long)pFVar3->enum_type_count_ < 1) {
    pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (0,(long)pFVar3->enum_type_count_,"index < enum_type_count()");
  }
  else {
    pcVar5 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar5 == (Nonnull<const_char_*>)0x0) {
    pEVar1 = pFVar3->enum_types_;
    v2 = (long)pEVar1->value_count_;
    if (v2 < 1) {
      pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (0,v2,"index < value_count()");
    }
    else {
      pcVar5 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar5 == (Nonnull<const_char_*>)0x0) {
      pEVar2 = pEVar1->values_;
      pcVar6 = anon_var_dwarf_a12c75 + 5;
      local_38._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (anon_var_dwarf_a12c75 + 5);
      testing::internal::
      PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
                (local_28,(char *)&local_38,(EnumValueOptions *)"value->options()");
      if (local_28[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_38);
        if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = (local_20->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_30,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x27e3,pcVar6);
        testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
        testing::internal::AssertHelper::~AssertHelper(&local_30);
        if (local_38._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_38._M_head_impl + 8))();
        }
      }
      if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_20,local_20);
      }
      pMVar4 = protobuf::internal::ExtensionSet::GetMessage
                         (&(pEVar2->merged_features_->field_0)._impl_._extensions_,pb::test,
                          (MessageLite *)PTR__TestFeatures_default_instance__019cf370);
      local_38._M_head_impl._0_4_ = *(undefined4 *)((long)&pMVar4[3]._internal_metadata_.ptr_ + 4);
      local_30.data_._0_4_ = 9;
      testing::internal::CmpHelperEQ<pb::EnumFeature,pb::EnumFeature>
                (local_28,"GetFeatures(value).GetExtension(pb::test).multiple_feature()",
                 "pb::VALUE9",(EnumFeature *)&local_38,(EnumFeature *)&local_30);
      if (local_28[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_38);
        if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar6 = (local_20->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_30,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x27e5,pcVar6);
        testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
        testing::internal::AssertHelper::~AssertHelper(&local_30);
        if (local_38._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_38._M_head_impl + 8))();
        }
      }
      if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_20,local_20);
      }
      pMVar4 = protobuf::internal::ExtensionSet::GetMessage
                         (&(pEVar2->merged_features_->field_0)._impl_._extensions_,pb::test,
                          (MessageLite *)PTR__TestFeatures_default_instance__019cf370);
      local_38._M_head_impl._0_4_ = *(undefined4 *)&pMVar4[3]._vptr_MessageLite;
      local_30.data_._0_4_ = 8;
      testing::internal::CmpHelperEQ<pb::EnumFeature,pb::EnumFeature>
                (local_28,"GetFeatures(value).GetExtension(pb::test).enum_entry_feature()",
                 "pb::VALUE8",(EnumFeature *)&local_38,(EnumFeature *)&local_30);
      if (local_28[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_38);
        if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar6 = (local_20->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_30,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x27e7,pcVar6);
        testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
        testing::internal::AssertHelper::~AssertHelper(&local_30);
        if (local_38._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_38._M_head_impl + 8))();
        }
      }
      if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_20,local_20);
      }
      return;
    }
  }
  else {
    TestBody();
  }
  TestBody();
  testing::internal::AssertHelper::~AssertHelper(&local_30);
  if (local_38._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_38._M_head_impl + 8))();
  }
  local_38._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST_F(FeaturesTest, EnumValueFeaturesOverride) {
  BuildDescriptorMessagesInTestPool();
  BuildFileInTestPool(pb::TestFeatures::descriptor()->file());
  const FileDescriptor* file = BuildFile(R"pb(
    name: "foo.proto"
    syntax: "editions"
    edition: EDITION_2023
    dependency: "google/protobuf/unittest_features.proto"
    options {
      features {
        [pb.test] { multiple_feature: VALUE7 }
      }
    }
    enum_type {
      name: "Foo"
      options {
        features {
          [pb.test] { multiple_feature: VALUE8 }
        }
      }
      value {
        name: "BAR"
        number: 0
        options {
          features {
            [pb.test] { multiple_feature: VALUE9 enum_entry_feature: VALUE8 }
          }
        }
      }
    }
  )pb");
  const EnumValueDescriptor* value = file->enum_type(0)->value(0);
  EXPECT_THAT(value->options(), EqualsProto(""));
  EXPECT_EQ(GetFeatures(value).GetExtension(pb::test).multiple_feature(),
            pb::VALUE9);
  EXPECT_EQ(GetFeatures(value).GetExtension(pb::test).enum_entry_feature(),
            pb::VALUE8);
}